

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feebumper.cpp
# Opt level: O0

bool wallet::feebumper::SignTransaction(CWallet *wallet,CMutableTransaction *mtx)

{
  long lVar1;
  bool bVar2;
  byte bVar3;
  _Optional_base<common::PSBTError,_true,_true> psbtx_00;
  CMutableTransaction *in_RDI;
  long in_FS_OFFSET;
  bool complete;
  optional<common::PSBTError> err;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock3;
  PartiallySignedTransaction psbtx;
  size_t *in_stack_00000200;
  PartiallySignedTransaction *in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  CWallet *in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe88;
  undefined1 in_stack_fffffffffffffe8c;
  undefined1 in_stack_fffffffffffffe8d;
  undefined1 in_stack_fffffffffffffe8e;
  undefined1 in_stack_fffffffffffffe8f;
  char *in_stack_fffffffffffffe90;
  char *in_stack_fffffffffffffe98;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea7;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  undefined6 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffece;
  undefined1 in_stack_fffffffffffffecf;
  CMutableTransaction *in_stack_ffffffffffffff18;
  CWallet *in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff2d;
  undefined1 in_stack_ffffffffffffff2e;
  undefined1 in_stack_ffffffffffffff2f;
  bool *in_stack_ffffffffffffff30;
  PartiallySignedTransaction *in_stack_ffffffffffffff38;
  CWallet *in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff74;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffe68);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
             (AnnotatedMixin<std::recursive_mutex> *)
             CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),in_stack_fffffffffffffe98
             ,in_stack_fffffffffffffe90,
             CONCAT13(in_stack_fffffffffffffe8f,
                      CONCAT12(in_stack_fffffffffffffe8e,
                               CONCAT11(in_stack_fffffffffffffe8d,in_stack_fffffffffffffe8c))),
             SUB41((uint)in_stack_fffffffffffffe88 >> 0x18,0));
  bVar2 = CWallet::IsWalletFlagSet
                    (in_stack_fffffffffffffe78,
                     CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
  if (bVar2) {
    PartiallySignedTransaction::PartiallySignedTransaction
              ((PartiallySignedTransaction *)
               CONCAT17(in_stack_fffffffffffffecf,
                        CONCAT16(in_stack_fffffffffffffece,in_stack_fffffffffffffec8)),in_RDI);
    CWallet::FillPSBT(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                      in_stack_ffffffffffffff74,(bool)in_stack_ffffffffffffff2f,
                      (bool)in_stack_ffffffffffffff2e,in_stack_00000200,
                      (bool)in_stack_ffffffffffffff2d);
    in_stack_fffffffffffffe68 = (PartiallySignedTransaction *)0x0;
    psbtx_00._M_payload.super__Optional_payload_base<common::PSBTError> =
         (_Optional_payload<common::PSBTError,_true,_true,_true>)
         CWallet::FillPSBT(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                           in_stack_ffffffffffffff30,in_stack_ffffffffffffff74,
                           (bool)in_stack_ffffffffffffff2f,(bool)in_stack_ffffffffffffff2e,
                           in_stack_00000200,(bool)in_stack_ffffffffffffff2d);
    bVar2 = std::optional::operator_cast_to_bool
                      ((optional<common::PSBTError> *)in_stack_fffffffffffffe68);
    if (bVar2) {
      bVar3 = false;
    }
    else {
      bVar3 = FinalizeAndExtractPSBT
                        ((PartiallySignedTransaction *)
                         psbtx_00._M_payload.super__Optional_payload_base<common::PSBTError>,
                         (CMutableTransaction *)
                         CONCAT17(in_stack_fffffffffffffe8f,
                                  CONCAT16(in_stack_fffffffffffffe8e,
                                           CONCAT15(in_stack_fffffffffffffe8d,
                                                    CONCAT14(in_stack_fffffffffffffe8c,
                                                             in_stack_fffffffffffffe88)))));
    }
    PartiallySignedTransaction::~PartiallySignedTransaction(in_stack_fffffffffffffe68);
  }
  else {
    bVar3 = CWallet::SignTransaction(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffe68);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(bVar3 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool SignTransaction(CWallet& wallet, CMutableTransaction& mtx) {
    LOCK(wallet.cs_wallet);

    if (wallet.IsWalletFlagSet(WALLET_FLAG_EXTERNAL_SIGNER)) {
        // Make a blank psbt
        PartiallySignedTransaction psbtx(mtx);

        // First fill transaction with our data without signing,
        // so external signers are not asked to sign more than once.
        bool complete;
        wallet.FillPSBT(psbtx, complete, SIGHASH_ALL, false /* sign */, true /* bip32derivs */);
        auto err{wallet.FillPSBT(psbtx, complete, SIGHASH_ALL, true /* sign */, false  /* bip32derivs */)};
        if (err) return false;
        complete = FinalizeAndExtractPSBT(psbtx, mtx);
        return complete;
    } else {
        return wallet.SignTransaction(mtx);
    }
}